

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

int __thiscall doctest::Context::run(Context *this)

{
  undefined8 uVar1;
  TestData *pTVar2;
  char *pcVar3;
  TestData *pTVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ContextState *pCVar9;
  const_iterator cVar10;
  code *__compar;
  detail *this_00;
  Color *pCVar11;
  char *pcVar12;
  ContextState *__base;
  Color *pCVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  testArray;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilters;
  char buff [1024];
  uint local_524;
  ulong local_520;
  ContextState *local_518;
  ContextState *pCStack_510;
  long local_508;
  undefined1 local_4f8 [32];
  _Rb_tree_node_base local_4d8;
  undefined8 local_4b8;
  undefined1 local_4b0 [48];
  undefined1 local_480 [48];
  undefined1 local_450 [24];
  String local_438 [129];
  
  pCVar9 = this->p;
  detail::getContextState::data = pCVar9;
  pCVar9->numAssertions = 0;
  pCVar9->numFailedAssertions = 0;
  if (((pCVar9->no_run != false) || ((pCVar9->version & 1U) != 0)) || (pCVar9->help == true)) {
    this_00 = (detail *)this;
    if ((pCVar9->version & 1U) != 0) {
      detail::printVersion((detail *)this);
      pCVar9 = this->p;
    }
    if (pCVar9->help == true) {
      detail::printHelp(this_00);
    }
    detail::getContextState::data = (ContextState *)0x0;
    return 0;
  }
  pCVar11 = (Color *)this;
  detail::printVersion((detail *)this);
  detail::Color::use(pCVar11,Cyan);
  pCVar11 = (Color *)0x108431;
  printf("%s");
  detail::Color::use(pCVar11,None);
  pcVar12 = "run with \"--help\" for options";
  puts("run with \"--help\" for options");
  detail::getRegisteredTests();
  local_518 = (ContextState *)0x0;
  pCStack_510 = (ContextState *)0x0;
  local_508 = 0;
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar9 = (ContextState *)
             detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar12 = (char *)pCVar9;
      local_438[0].m_str =
           (char *)&(((ContextState *)pcVar12)->filters).
                    super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      std::vector<doctest::detail::TestData_const*,std::allocator<doctest::detail::TestData_const*>>
      ::emplace_back<doctest::detail::TestData_const*>
                ((vector<doctest::detail::TestData_const*,std::allocator<doctest::detail::TestData_const*>>
                  *)&local_518,(TestData **)local_438);
      pCVar9 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar12);
      __base = local_518;
    } while (pCVar9 != (ContextState *)
                       &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
    lVar15 = (long)pCStack_510 - (long)local_518;
    if (lVar15 != 0) {
      pCVar9 = this->p;
      pcVar12 = (pCVar9->order_by).m_str;
      iVar6 = detail::stricmp(pcVar12,"file");
      if (iVar6 == 0) {
        __compar = detail::fileOrderComparator;
      }
      else {
        iVar6 = detail::stricmp(pcVar12,"suite");
        if (iVar6 == 0) {
          __compar = detail::suiteOrderComparator;
        }
        else {
          iVar6 = detail::stricmp(pcVar12,"name");
          if (iVar6 != 0) {
            iVar6 = detail::stricmp(pcVar12,"rand");
            if (iVar6 == 0) {
              uVar7 = pCVar9->rand_seed;
              pcVar12 = (char *)(ulong)uVar7;
              srand(uVar7);
              pCVar9 = local_518;
              uVar16 = (ulong)((long)pCStack_510 - (long)local_518) >> 3;
              uVar7 = (int)uVar16 - 1;
              if (uVar7 != 0) {
                uVar5 = (ulong)uVar7;
                do {
                  uVar14 = uVar5 - 1;
                  uVar7 = rand();
                  uVar1 = *(undefined8 *)
                           (&(pCVar9->super_TestAccessibleContextState).success + uVar5 * 8);
                  lVar15 = (long)(int)((ulong)uVar7 % (uVar16 & 0xffffffff));
                  *(undefined8 *)(&(pCVar9->super_TestAccessibleContextState).success + uVar5 * 8) =
                       *(undefined8 *)
                        (&(pCVar9->super_TestAccessibleContextState).success + lVar15 * 8);
                  *(undefined8 *)(&(pCVar9->super_TestAccessibleContextState).success + lVar15 * 8)
                       = uVar1;
                  uVar16 = (ulong)((int)uVar16 - 1);
                  uVar5 = uVar14;
                } while ((int)uVar14 != 0);
              }
            }
            goto LAB_00105e5f;
          }
          __compar = detail::nameOrderComparator;
        }
      }
      qsort(__base,lVar15 >> 3,8,__compar);
      pcVar12 = (char *)__base;
    }
  }
LAB_00105e5f:
  pCVar9 = this->p;
  if (pCVar9->list_test_cases == true) {
    detail::Color::use((Color *)pcVar12,Cyan);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    pcVar12 = "listing all test case names";
    puts("listing all test case names");
    pCVar9 = this->p;
  }
  local_4d8._M_left = &local_4d8;
  local_4d8._M_color = _S_red;
  local_4d8._M_parent = (_Base_ptr)0x0;
  local_520 = 0;
  local_4b8._0_4_ = 0;
  local_4b8._4_4_ = 0;
  local_4d8._M_right = local_4d8._M_left;
  if (pCVar9->list_test_suites == true) {
    detail::Color::use((Color *)pcVar12,Cyan);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    pcVar12 = "listing all test suites";
    puts("listing all test suites");
  }
  local_524 = 0;
  if (pCStack_510 != local_518) {
    local_524 = 0;
    local_520 = 0;
    uVar16 = 0;
    do {
      pcVar12 = local_4f8;
      pTVar2 = *(TestData **)(&(local_518->super_TestAccessibleContextState).success + uVar16 * 8);
      pcVar3 = pTVar2->m_file;
      std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar12,
                 (this->p->filters).
                 super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_> *
                                        )pcVar12,1,this->p->case_sensitive);
      std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar12);
      if (iVar6 != 0) {
        pcVar12 = pTVar2->m_file;
        std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_450,
                   (this->p->filters).
                   super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        iVar6 = detail::matchesAny(pcVar12,(vector<doctest::String,_std::allocator<doctest::String>_>
                                            *)local_450,0,this->p->case_sensitive);
        pcVar12 = (char *)local_450;
        std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_450);
        if (iVar6 == 0) {
          pcVar3 = pTVar2->m_suite;
          std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)(local_480 + 0x18)
                     ,(this->p->filters).
                      super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2);
          pcVar12 = local_480 + 0x18;
          iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_>
                                             *)pcVar12,1,this->p->case_sensitive);
          std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar12);
          if (iVar6 != 0) {
            pcVar3 = pTVar2->m_suite;
            std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_480,
                       (this->p->filters).
                       super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 3);
            pcVar12 = local_480;
            iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_>
                                               *)pcVar12,0,this->p->case_sensitive);
            std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar12);
            if (iVar6 == 0) {
              pcVar3 = pTVar2->m_name;
              std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                        ((vector<doctest::String,_std::allocator<doctest::String>_> *)
                         (local_4b0 + 0x18),
                         (this->p->filters).
                         super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
              pcVar12 = local_4b0 + 0x18;
              iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_>
                                                 *)pcVar12,1,this->p->case_sensitive);
              std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                        ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar12);
              if (iVar6 != 0) {
                pcVar3 = pTVar2->m_name;
                std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                          ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_4b0,
                           (this->p->filters).
                           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 5);
                pcVar12 = local_4b0;
                iVar6 = detail::matchesAny(pcVar3,(
                                                  vector<doctest::String,_std::allocator<doctest::String>_>
                                                  *)pcVar12,0,this->p->case_sensitive);
                std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                          ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar12);
                if (iVar6 == 0) {
                  uVar7 = (int)local_520 + 1;
                  local_520 = (ulong)uVar7;
                  pcVar12 = (char *)this->p;
                  if (((ContextState *)pcVar12)->count == false) {
                    if (((ContextState *)pcVar12)->list_test_cases == true) {
                      pcVar12 = pTVar2->m_name;
                      puts(pcVar12);
                    }
                    else if (((ContextState *)pcVar12)->list_test_suites == true) {
                      String::String(local_438,pTVar2->m_suite);
                      cVar10 = std::
                               _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                               ::find((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                                       *)(local_4f8 + 0x18),local_438);
                      pcVar12 = local_438[0].m_str;
                      free(local_438[0].m_str);
                      if (cVar10._M_node == &local_4d8) {
                        puts(pTVar2->m_suite);
                        String::String(local_438,pTVar2->m_suite);
                        std::
                        _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                        ::_M_insert_unique<doctest::String>
                                  ((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                                    *)(local_4f8 + 0x18),local_438);
                        pcVar12 = local_438[0].m_str;
                        free(local_438[0].m_str);
                      }
                    }
                    else if (((ContextState *)pcVar12)->first <= uVar7 &&
                             (((ContextState *)pcVar12)->last < ((ContextState *)pcVar12)->first ||
                             uVar7 <= ((ContextState *)pcVar12)->last)) {
                      (((ContextState *)pcVar12)->super_TestAccessibleContextState).currentTest =
                           pTVar2;
                      (((ContextState *)pcVar12)->super_TestAccessibleContextState).
                      hasLoggedCurrentTestStart = false;
                      if ((*(char *)&(((_Vector_impl *)
                                      &(((ContextState *)pcVar12)->super_TestAccessibleContextState)
                                       .success)->super__Vector_impl_data)._M_start == '\x01') &&
                         ((detail::getContextState::data->super_TestAccessibleContextState).
                          hasLoggedCurrentTestStart == false)) {
                        pTVar4 = (detail::getContextState::data->super_TestAccessibleContextState).
                                 currentTest;
                        detail::logTestStart(pTVar4->m_name,pTVar4->m_file,pTVar4->m_line);
                        (detail::getContextState::data->super_TestAccessibleContextState).
                        hasLoggedCurrentTestStart = true;
                        pcVar12 = (char *)this->p;
                      }
                      std::
                      _Rb_tree<doctest::detail::SubcaseSignature,_doctest::detail::SubcaseSignature,_std::_Identity<doctest::detail::SubcaseSignature>,_std::less<doctest::detail::SubcaseSignature>,_std::allocator<doctest::detail::SubcaseSignature>_>
                      ::clear(&(((ContextState *)pcVar12)->subcasesPassed)._M_t);
                      pcVar12 = (char *)this->p;
                      iVar6 = 0;
                      do {
                        while( true ) {
                          (((ContextState *)pcVar12)->super_TestAccessibleContextState).
                          numAssertionsForCurrentTestcase = 0;
                          ((ContextState *)pcVar12)->numFailedAssertionsForCurrentTestcase = 0;
                          ((ContextState *)pcVar12)->subcasesHasSkipped = false;
                          ((ContextState *)pcVar12)->subcasesCurrentLevel = 0;
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::clear(&(((ContextState *)pcVar12)->subcasesEnteredLevels)._M_t);
                          iVar8 = detail::callTestFunc(pTVar2->m_f);
                          iVar6 = iVar6 + iVar8;
                          pcVar12 = (char *)this->p;
                          iVar8 = ((ContextState *)pcVar12)->abort_after;
                          ((ContextState *)pcVar12)->numAssertions =
                               ((ContextState *)pcVar12)->numAssertions +
                               (((ContextState *)pcVar12)->super_TestAccessibleContextState).
                               numAssertionsForCurrentTestcase;
                          if (iVar8 < 1) break;
                          if (iVar8 <= ((ContextState *)pcVar12)->numFailedAssertions) {
                            ((ContextState *)pcVar12)->subcasesHasSkipped = false;
                          }
                          (((ContextState *)pcVar12)->super_TestAccessibleContextState).
                          hasLoggedCurrentTestStart = false;
                          if (((ContextState *)pcVar12)->subcasesHasSkipped == false) {
                            local_524 = (local_524 + 1) - (uint)(iVar6 == 0);
                            if ((iVar8 < 1) ||
                               (((ContextState *)pcVar12)->numFailedAssertions < iVar8))
                            goto LAB_00105fcc;
                            goto LAB_0010631f;
                          }
                        }
                        (((ContextState *)pcVar12)->super_TestAccessibleContextState).
                        hasLoggedCurrentTestStart = false;
                      } while (((ContextState *)pcVar12)->subcasesHasSkipped != false);
                      local_524 = (local_524 + 1) - (uint)(iVar6 == 0);
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00105fcc:
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (uVar16 < (ulong)((long)pCStack_510 - (long)local_518 >> 3));
  }
LAB_0010631f:
  detail::Color::use((Color *)pcVar12,(local_524 == 0) + Red);
  pCVar11 = (Color *)&DAT_001092fd;
  puts("===============================================================================");
  detail::Color::use(pCVar11,None);
  pCVar9 = this->p;
  if (((pCVar9->count == false) && (pCVar9->list_test_cases == false)) &&
     (pCVar9->list_test_suites != true)) {
    detail::Color::use(pCVar11,Cyan);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    pCVar11 = (Color *)local_438;
    snprintf((char *)pCVar11,0x400,"test cases: %4d",local_520);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar11,None);
      pCVar11 = (Color *)0x108431;
      printf("%s");
      detail::Color::use(pCVar11,None);
    }
    pCVar13 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar11,None);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    snprintf((char *)pCVar13,0x400,"%4d passed",(ulong)((int)local_520 - local_524));
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar13,(uint)(local_524 == 0) * 3);
      pCVar13 = (Color *)0x108431;
      printf("%s");
      detail::Color::use(pCVar13,None);
    }
    pCVar11 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar13,None);
    pCVar13 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar13,None);
    snprintf((char *)pCVar11,0x400,"%4d failed",(ulong)local_524);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar11,(uint)(local_524 != 0) * 2);
      pCVar11 = (Color *)0x108431;
      printf("%s");
      detail::Color::use(pCVar11,None);
    }
    pCVar13 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar11,None);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    snprintf((char *)pCVar13,0x400,"%4d skipped\n",
             (ulong)(uint)((int)((ulong)((long)pCStack_510 - (long)local_518) >> 3) - (int)local_520
                          ));
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar13,None);
      pCVar13 = (Color *)0x108431;
      printf("%s");
      detail::Color::use(pCVar13,None);
    }
    detail::Color::use(pCVar13,Cyan);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    pCVar11 = (Color *)local_438;
    snprintf((char *)pCVar11,0x400,"assertions: %4d",(ulong)(uint)this->p->numAssertions);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar11,None);
      pCVar11 = (Color *)0x108431;
      printf("%s");
      detail::Color::use(pCVar11,None);
    }
    pCVar13 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar11,None);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    snprintf((char *)pCVar13,0x400,"%4d passed",
             (ulong)(uint)(this->p->numAssertions - this->p->numFailedAssertions));
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar13,(uint)(local_524 == 0) * 3);
      pCVar13 = (Color *)0x108431;
      printf("%s");
      detail::Color::use(pCVar13,None);
    }
    pCVar11 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar13,None);
    pCVar13 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar13,None);
    snprintf((char *)pCVar11,0x400,"%4d failed",(ulong)(uint)this->p->numFailedAssertions);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar11,(uint)(0 < this->p->numFailedAssertions) * 2);
      pCVar11 = (Color *)0x108431;
      printf("%s");
      detail::Color::use(pCVar11,None);
    }
    local_438[0].m_str._0_4_ = 0xa7c20;
    detail::Color::use(pCVar11,None);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
  }
  else {
    detail::Color::use(pCVar11,Cyan);
    pCVar11 = (Color *)0x108431;
    printf("%s");
    detail::Color::use(pCVar11,None);
    printf("number of tests passing the current filters: %d\n",local_520);
  }
  detail::getContextState::data = (ContextState *)0x0;
  if ((local_524 == 0) || (iVar6 = 1, this->p->no_exitcode == true)) {
    iVar6 = 0;
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
               *)(local_4f8 + 0x18));
  if (local_518 != (ContextState *)0x0) {
    operator_delete(local_518,local_508 - (long)local_518);
  }
  return iVar6;
}

Assistant:

int Context::run() {
    using namespace detail;

    getContextState() = p;
    p->resetRunData();

    // handle version, help and no_run
    if(p->no_run || p->version || p->help) {
        if(p->version)
            printVersion();
        if(p->help)
            printHelp();

        getContextState() = 0;

        return EXIT_SUCCESS;
    }

    printVersion();
    DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
    printf("run with \"--help\" for options\n");

    unsigned i = 0; // counter used for loops - here for VC6

    std::set<TestData>& registeredTests = getRegisteredTests();

    std::vector<const TestData*> testArray;
    for(std::set<TestData>::iterator it = registeredTests.begin(); it != registeredTests.end();
        ++it)
        testArray.push_back(&(*it));

    // sort the collected records
    if(testArray.size() > 0) {
        if(p->order_by.compare("file", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            srand(p->rand_seed);

            // random_shuffle implementation
            const TestData** first = &testArray[0];
            for(i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = rand() % (i + 1);

                const TestData* temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        }
    }

    if(p->list_test_cases) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test case names\n");
    }

    std::set<String> testSuitesPassingFilters;
    if(p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test suites\n");
    }

    unsigned numTestsPassingFilters = 0;
    unsigned numFailed              = 0;
    // invoke the registered functions if they match the filter criteria (or just count them)
    for(i = 0; i < testArray.size(); i++) {
        const TestData& data = *testArray[i];
        if(!matchesAny(data.m_file, p->filters[0], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_file, p->filters[1], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_suite, p->filters[2], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_suite, p->filters[3], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_name, p->filters[4], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_name, p->filters[5], 0, p->case_sensitive))
            continue;

        numTestsPassingFilters++;

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            printf("%s\n", data.m_name);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if(testSuitesPassingFilters.count(data.m_suite) == 0) {
                printf("%s\n", data.m_suite);
                testSuitesPassingFilters.insert(data.m_suite);
            }
            continue;
        }

        // skip the test if it is not in the execution range
        if((p->last < numTestsPassingFilters && p->first <= p->last) ||
           (p->first > numTestsPassingFilters))
            continue;

        // execute the test if it passes all the filtering
        {
#ifdef _MSC_VER
//__try {
#endif // _MSC_VER

            p->currentTest = &data;

            // if logging successful tests - force the start log
            p->hasLoggedCurrentTestStart = false;
            if(p->success)
                DOCTEST_LOG_START();

            unsigned didFail = 0;
            p->subcasesPassed.clear();
            do {
                // reset the assertion state
                p->numAssertionsForCurrentTestcase       = 0;
                p->numFailedAssertionsForCurrentTestcase = 0;

                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->subcasesHasSkipped   = false;
                p->subcasesCurrentLevel = 0;
                p->subcasesEnteredLevels.clear();

                // execute the test
                didFail += callTestFunc(data.m_f);
                p->numAssertions += p->numAssertionsForCurrentTestcase;

                // exit this loop if enough assertions have failed
                if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                    p->subcasesHasSkipped = false;

                // if the start has been logged
                if(p->hasLoggedCurrentTestStart)
                    logTestEnd();
                p->hasLoggedCurrentTestStart = false;

            } while(p->subcasesHasSkipped == true);

            if(didFail > 0)
                numFailed++;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                break;

#ifdef _MSC_VER
//} __except(1) {
//    printf("Unknown SEH exception caught!\n");
//    numFailed++;
//}
#endif // _MSC_VER
        }
    }

    DOCTEST_PRINTF_COLORED(getSeparator(), numFailed > 0 ? Color::Red : Color::Green);
    if(p->count || p->list_test_cases || p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("number of tests passing the current filters: %d\n", numTestsPassingFilters);
    } else {
        char buff[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "test cases: %4d", numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         numTestsPassingFilters - numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d skipped\n",
                         static_cast<unsigned>(testArray.size()) - numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "assertions: %4d", p->numAssertions);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         p->numAssertions - p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, p->numFailedAssertions > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " |\n");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
    }

    // remove any coloring
    DOCTEST_PRINTF_COLORED("", Color::None);

    getContextState() = 0;

    if(numFailed && !p->no_exitcode)
        return EXIT_FAILURE;
    return EXIT_SUCCESS;
}